

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O0

void __thiscall
PA5Application::RenderObjectPart::RenderObjectPart
          (RenderObjectPart *this,shared_ptr<VAO> *vao,shared_ptr<Program> *program,
          shared_ptr<Texture> *texture,shared_ptr<Texture> *ntexture,shared_ptr<Texture> *stexture)

{
  shared_ptr<Texture> *stexture_local;
  shared_ptr<Texture> *ntexture_local;
  shared_ptr<Texture> *texture_local;
  shared_ptr<Program> *program_local;
  shared_ptr<VAO> *vao_local;
  RenderObjectPart *this_local;
  
  std::shared_ptr<VAO>::shared_ptr(&this->m_vao,vao);
  std::shared_ptr<Program>::shared_ptr(&this->m_program,program);
  std::shared_ptr<Texture>::shared_ptr(&this->m_diffuseTexture,texture);
  std::shared_ptr<Texture>::shared_ptr(&this->m_normalTexture,ntexture);
  std::shared_ptr<Texture>::shared_ptr(&this->m_specularTexture,stexture);
  return;
}

Assistant:

PA5Application::RenderObjectPart::RenderObjectPart(std::shared_ptr<VAO> vao, std::shared_ptr<Program> program, std::shared_ptr<Texture> texture, std::shared_ptr<Texture> ntexture,
                                                   std::shared_ptr<Texture> stexture)
    : m_vao(vao), m_program(program), m_diffuseTexture(texture), m_normalTexture(ntexture), m_specularTexture(stexture)
{
}